

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-validator.cpp
# Opt level: O2

void __thiscall wasm::FunctionValidator::visitStructSet(FunctionValidator *this,StructSet *curr)

{
  uint uVar1;
  pointer pFVar2;
  bool bVar3;
  Struct *pSVar4;
  HeapType local_30;
  HeapType type;
  
  shouldBeTrue<wasm::StructSet*>
            (this,(bool)((byte)((((this->
                                  super_WalkerPass<wasm::PostWalker<wasm::FunctionValidator,_wasm::Visitor<wasm::FunctionValidator,_void>_>_>
                                  ).
                                  super_PostWalker<wasm::FunctionValidator,_wasm::Visitor<wasm::FunctionValidator,_void>_>
                                  .
                                  super_Walker<wasm::FunctionValidator,_wasm::Visitor<wasm::FunctionValidator,_void>_>
                                 .currModule)->features).features >> 10) & 1),curr,
             "struct.set requires gc [--enable-gc]");
  if ((curr->ref->type).id != 1) {
    bVar3 = wasm::Type::isRef(&curr->ref->type);
    bVar3 = shouldBeTrue<wasm::Expression*>
                      (this,bVar3,curr->ref,"struct.set ref must be a reference type");
    if (bVar3) {
      local_30 = wasm::Type::getHeapType(&curr->ref->type);
      if (local_30.id != 0xb) {
        bVar3 = HeapType::isStruct(&local_30);
        bVar3 = shouldBeTrue<wasm::Expression*>
                          (this,bVar3,curr->ref,"struct.set ref must be a struct");
        if (bVar3) {
          pSVar4 = HeapType::getStruct(&local_30);
          shouldBeTrue<wasm::StructSet*>
                    (this,(ulong)curr->index <
                          (ulong)((long)(pSVar4->fields).
                                        super__Vector_base<wasm::Field,_std::allocator<wasm::Field>_>
                                        ._M_impl.super__Vector_impl_data._M_finish -
                                  (long)(pSVar4->fields).
                                        super__Vector_base<wasm::Field,_std::allocator<wasm::Field>_>
                                        ._M_impl.super__Vector_impl_data._M_start >> 4),curr,
                     "bad struct.get field");
          uVar1 = curr->index;
          pFVar2 = (pSVar4->fields).super__Vector_base<wasm::Field,_std::allocator<wasm::Field>_>.
                   _M_impl.super__Vector_impl_data._M_start;
          shouldBeSubType(this,(Type)(curr->value->type).id,(Type)pFVar2[uVar1].type.id,
                          (Expression *)curr,"struct.set must have the proper type");
          shouldBeEqual<wasm::StructSet*,wasm::Mutability>
                    (this,pFVar2[uVar1].mutable_,Mutable,curr,"struct.set field must be mutable");
        }
      }
    }
  }
  return;
}

Assistant:

void FunctionValidator::visitStructSet(StructSet* curr) {
  shouldBeTrue(getModule()->features.hasGC(),
               curr,
               "struct.set requires gc [--enable-gc]");
  if (curr->ref->type == Type::unreachable) {
    return;
  }
  if (!shouldBeTrue(curr->ref->type.isRef(),
                    curr->ref,
                    "struct.set ref must be a reference type")) {
    return;
  }
  auto type = curr->ref->type.getHeapType();
  if (type == HeapType::none) {
    return;
  }
  if (!shouldBeTrue(
        type.isStruct(), curr->ref, "struct.set ref must be a struct")) {
    return;
  }
  const auto& fields = type.getStruct().fields;
  shouldBeTrue(curr->index < fields.size(), curr, "bad struct.get field");
  auto& field = fields[curr->index];
  shouldBeSubType(curr->value->type,
                  field.type,
                  curr,
                  "struct.set must have the proper type");
  shouldBeEqual(
    field.mutable_, Mutable, curr, "struct.set field must be mutable");
}